

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O0

SVInt __thiscall slang::SVInt::udiv(SVInt *this,SVInt *lhs,SVInt *rhs,bool bothSigned)

{
  bool bVar1;
  logic_t rhs_00;
  bitwidth_t bVar2;
  uint32_t uVar3;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 uVar4;
  SVInt SVar5;
  uint local_60;
  uint local_5c;
  uint32_t rhsWords;
  bitwidth_t rhsBits;
  uint32_t lhsWords;
  bitwidth_t lhsBits;
  bool bothSigned_local;
  SVInt *rhs_local;
  SVInt *lhs_local;
  SVInt *quotient;
  
  bVar1 = isSingleWord(lhs);
  if (bVar1) {
    SVInt(this,(lhs->super_SVIntStorage).bitWidth,
          (lhs->super_SVIntStorage).field_0.val / (rhs->super_SVIntStorage).field_0.val,bothSigned);
    uVar4 = extraout_RDX;
  }
  else {
    bVar2 = getActiveBits(lhs);
    if (bVar2 == 0) {
      local_5c = 0;
    }
    else {
      uVar3 = whichWord(bVar2 - 1);
      local_5c = uVar3 + 1;
    }
    bVar2 = getActiveBits(rhs);
    if (bVar2 == 0) {
      local_60 = 0;
    }
    else {
      uVar3 = whichWord(bVar2 - 1);
      local_60 = uVar3 + 1;
    }
    if (local_5c == 0) {
      SVInt(this,(lhs->super_SVIntStorage).bitWidth,0,bothSigned);
      uVar4 = extraout_RDX_00;
    }
    else if (lhs == rhs) {
      SVInt(this,(lhs->super_SVIntStorage).bitWidth,1,bothSigned);
      uVar4 = extraout_RDX_01;
    }
    else {
      rhs_00 = operator<(lhs,rhs);
      bVar1 = slang::operator||(local_5c < local_60,rhs_00);
      if (bVar1) {
        SVInt(this,(lhs->super_SVIntStorage).bitWidth,0,bothSigned);
        uVar4 = extraout_RDX_02;
      }
      else if ((local_5c == 1) && (local_60 == 1)) {
        SVInt(this,(lhs->super_SVIntStorage).bitWidth,
              *(lhs->super_SVIntStorage).field_0.pVal / *(rhs->super_SVIntStorage).field_0.pVal,
              bothSigned);
        uVar4 = extraout_RDX_03;
      }
      else {
        SVInt(this);
        divide(lhs,local_5c,rhs,local_60,this,(SVInt *)0x0);
        uVar4 = extraout_RDX_04;
      }
    }
  }
  SVar5.super_SVIntStorage.bitWidth = (int)uVar4;
  SVar5.super_SVIntStorage.signFlag = (bool)(char)((ulong)uVar4 >> 0x20);
  SVar5.super_SVIntStorage.unknownFlag = (bool)(char)((ulong)uVar4 >> 0x28);
  SVar5.super_SVIntStorage._14_2_ = (short)((ulong)uVar4 >> 0x30);
  SVar5.super_SVIntStorage.field_0.pVal = (uint64_t *)this;
  return (SVInt)SVar5.super_SVIntStorage;
}

Assistant:

SVInt SVInt::udiv(const SVInt& lhs, const SVInt& rhs, bool bothSigned) {
    // At this point we have two values with the same bit widths, both positive,
    // and X's have been dealt with. Also, we know rhs isn't zero.
    if (lhs.isSingleWord())
        return SVInt(lhs.bitWidth, lhs.val / rhs.val, bothSigned);

    bitwidth_t lhsBits = lhs.getActiveBits();
    uint32_t lhsWords = !lhsBits ? 0 : (whichWord(lhsBits - 1) + 1);
    bitwidth_t rhsBits = rhs.getActiveBits();
    uint32_t rhsWords = !rhsBits ? 0 : (whichWord(rhsBits - 1) + 1);

    // 0 / X
    if (!lhsWords)
        return SVInt(lhs.bitWidth, 0, bothSigned);
    // X / X
    if (&lhs == &rhs)
        return SVInt(lhs.bitWidth, 1, bothSigned);
    // X / Y where X < Y
    if (lhsWords < rhsWords || lhs < rhs)
        return SVInt(lhs.bitWidth, 0, bothSigned);
    // X and Y are actually a single word
    if (lhsWords == 1 && rhsWords == 1)
        return SVInt(lhs.bitWidth, lhs.pVal[0] / rhs.pVal[0], bothSigned);

    // compute it the hard way with the Knuth algorithm
    SVInt quotient;
    divide(lhs, lhsWords, rhs, rhsWords, &quotient, nullptr);
    return quotient;
}